

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapArrayBufferInfo *pSVar1;
  uint32 i;
  ulong uVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->Length,CommaAndBigSpaceSeparator);
  if (pSVar1->Length != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (uVar2 = 0; uVar2 < pSVar1->Length; uVar2 = uVar2 + 1) {
      (*writer->_vptr_FileWriter[0xb])(writer,(ulong)pSVar1->Buff[uVar2],(ulong)(uVar2 != 0));
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayBufferInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            writer->WriteLengthValue(buffInfo->Length, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(buffInfo->Length > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < buffInfo->Length; ++i)
                {
                    writer->WriteNakedByte(buffInfo->Buff[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }